

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11.cpp
# Opt level: O1

void __thiscall
tcu::x11::XlibWindow::XlibWindow
          (XlibWindow *this,XlibDisplay *display,int width,int height,Visual *visual)

{
  Display *pDVar1;
  bool bVar2;
  VisualID visualID;
  undefined8 uVar3;
  Window WVar4;
  TestError *this_00;
  InternalError *this_01;
  int iVar5;
  int iVar6;
  undefined8 uVar7;
  Atom deleteAtom;
  VisualID VStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  unsigned_long local_c8;
  unsigned_long uStack_c0;
  unsigned_long local_b8;
  undefined8 uStack_b0;
  XSetWindowAttributes swa;
  
  (this->super_WindowBase).m_visible = false;
  (this->super_WindowBase)._vptr_WindowBase = (_func_int **)&PTR__XlibWindow_021032a0;
  this->m_display = display;
  this->m_colormap = 0;
  this->m_window = 0;
  pDVar1 = display->m_display;
  if (visual == (Visual *)0x0) {
    uVar7 = *(undefined8 *)(*(long *)(pDVar1 + 0xe8) + 0x10 + (long)*(int *)(pDVar1 + 0xe0) * 0x80);
    uVar3 = 0x808;
    visual = (Visual *)0x0;
  }
  else {
    local_b8 = 0;
    uStack_b0._0_4_ = 0;
    uStack_b0._4_4_ = 0;
    local_c8 = 0;
    uStack_c0 = 0;
    local_d8._0_4_ = 0;
    local_d8._4_4_ = 0;
    uStack_d0._0_4_ = 0;
    uStack_d0._4_4_ = 0;
    deleteAtom = 0;
    VStack_e0 = 0;
    visualID = XVisualIDFromVisual(visual);
    bVar2 = XlibDisplay::getVisualInfo(display,visualID,(XVisualInfo *)&deleteAtom);
    if (!bVar2) {
      this_01 = (InternalError *)__cxa_allocate_exception(0x38);
      InternalError::InternalError
                (this_01,(char *)0x0,"succ",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/platform/X11/tcuX11.cpp"
                 ,0xaf);
      __cxa_throw(this_01,&InternalError::typeinfo,Exception::~Exception);
    }
    uVar7 = *(undefined8 *)(*(long *)(pDVar1 + 0xe8) + 0x10 + (long)(int)local_d8 * 0x80);
    swa.colormap = XCreateColormap(pDVar1,uVar7,visual,0);
    this->m_colormap = swa.colormap;
    uVar3 = 0x2808;
  }
  swa.border_pixel = 0;
  swa.event_mask = 0x28003;
  iVar5 = 400;
  if (width != -1) {
    iVar5 = width;
  }
  iVar6 = 300;
  if (height != -1) {
    iVar6 = height;
  }
  WVar4 = XCreateWindow(pDVar1,uVar7,0,0,iVar5,iVar6,0,0,1,visual,uVar3,&swa);
  this->m_window = WVar4;
  if (WVar4 != 0) {
    deleteAtom = this->m_display->m_deleteAtom;
    XSetWMProtocols(pDVar1,WVar4,&deleteAtom,1);
    XSync(pDVar1,0);
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  TestError::TestError
            (this_00,(char *)0x0,"m_window",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/platform/X11/tcuX11.cpp"
             ,0xc1);
  __cxa_throw(this_00,&TestError::typeinfo,Exception::~Exception);
}

Assistant:

XlibWindow::XlibWindow (XlibDisplay& display, int width, int height, ::Visual* visual)
	: WindowBase	()
	, m_display		(display)
	, m_colormap	(None)
	, m_window		(None)
{
	XSetWindowAttributes	swa;
	::Display* const		dpy					= m_display.getXDisplay();
	::Window				root				= DefaultRootWindow(dpy);
	unsigned long			mask				= CWBorderPixel | CWEventMask;

	// If redirect is enabled, window size can't be guaranteed and it is up to
	// the window manager to decide whether to honor sizing requests. However,
	// overriding that causes window to appear as an overlay, which causes
	// other issues, so this is disabled by default.
	const bool				overrideRedirect	= false;

	if (overrideRedirect)
	{
		mask |= CWOverrideRedirect;
		swa.override_redirect = true;
	}

	if (visual == DE_NULL)
		visual = CopyFromParent;
	else
	{
		XVisualInfo	info	= XVisualInfo();
		bool		succ	= display.getVisualInfo(XVisualIDFromVisual(visual), info);

		TCU_CHECK_INTERNAL(succ);

		root				= RootWindow(dpy, info.screen);
		m_colormap			= XCreateColormap(dpy, root, visual, AllocNone);
		swa.colormap		= m_colormap;
		mask |= CWColormap;
	}

	swa.border_pixel	= 0;
	swa.event_mask		= ExposureMask|KeyPressMask|KeyReleaseMask|StructureNotifyMask;

	if (width == glu::RenderConfig::DONT_CARE)
		width = DEFAULT_WINDOW_WIDTH;
	if (height == glu::RenderConfig::DONT_CARE)
		height = DEFAULT_WINDOW_HEIGHT;

	m_window = XCreateWindow(dpy, root, 0, 0, width, height, 0,
							 CopyFromParent, InputOutput, visual, mask, &swa);
	TCU_CHECK(m_window);

	Atom deleteAtom = m_display.getDeleteAtom();
	XSetWMProtocols(dpy, m_window, &deleteAtom, 1);
	XSync(dpy,false);
}